

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O2

bool __thiscall de::FilePath::beginsWithDrive(FilePath *this)

{
  ulong uVar1;
  char cVar2;
  pointer pcVar3;
  int iVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  
  pcVar3 = (this->m_path)._M_dataplus._M_p;
  uVar7 = (this->m_path)._M_string_length;
  iVar4 = (int)uVar7;
  uVar5 = 0;
  uVar1 = 0;
  if (0 < iVar4) {
    uVar5 = uVar7 & 0xffffffff;
  }
  while (uVar7 = uVar1, bVar6 = (byte)this, uVar7 != uVar5) {
    cVar2 = pcVar3[uVar7];
    if (cVar2 == ':') {
      uVar1 = uVar7 + 1;
      if ((int)uVar1 < iVar4) {
        cVar2 = pcVar3[uVar1];
        this = (FilePath *)0x1;
        bVar6 = 1;
        if ((cVar2 == '\\') || (cVar2 == '/')) break;
      }
    }
    else {
      this = (FilePath *)0x0;
      bVar6 = 0;
      if ((cVar2 == '/') || (cVar2 == '\\')) break;
      uVar1 = uVar7 + 1;
    }
  }
  return (bool)((long)uVar7 < (long)iVar4 & bVar6);
}

Assistant:

bool FilePath::beginsWithDrive (void) const
{
	for (int ndx = 0; ndx < (int)m_path.length(); ndx++)
	{
		if (m_path[ndx] == ':' && ndx+1 < (int)m_path.length() && isSeparator(m_path[ndx+1]))
			return true; // First part is drive letter.
		if (isSeparator(m_path[ndx]))
			return false;
	}
	return false;
}